

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::VaryingLocationLimitTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,VaryingLocationLimitTest *this,GLuint test_case_index)

{
  ostream *poVar1;
  GLchar *pGVar2;
  char *pcVar3;
  pointer ptVar4;
  stringstream stream;
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  ptVar4 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationLimitTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start + test_case_index;
  poVar1 = std::operator<<(&local_1a0,"Stage: ");
  pGVar2 = Utils::Shader::GetStageName(ptVar4->m_stage);
  poVar1 = std::operator<<(poVar1,pGVar2);
  poVar1 = std::operator<<(poVar1," type: ");
  pGVar2 = Utils::Type::GetGLSLTypeName(&ptVar4->m_type);
  poVar1 = std::operator<<(poVar1,pGVar2);
  std::operator<<(poVar1,", direction: ");
  pcVar3 = "output";
  if (ptVar4->m_is_input != false) {
    pcVar3 = "input";
  }
  std::operator<<(&local_1a0,pcVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingLocationLimitTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage)
		   << " type: " << test_case.m_type.GetGLSLTypeName() << ", direction: ";

	if (true == test_case.m_is_input)
	{
		stream << "input";
	}
	else
	{
		stream << "output";
	}

	return stream.str();
}